

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psintrp.c
# Opt level: O1

void cf2_doBlend(CFF_Blend blend,CF2_Stack opStack,FT_UFast numBlends)

{
  int iVar1;
  FT_Int32 *pFVar2;
  int *piVar3;
  int iVar4;
  CF2_F16Dot16 CVar5;
  CF2_F16Dot16 CVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  FT_UFast idx;
  long lVar11;
  FT_UFast FVar12;
  FT_UFast idx_00;
  
  iVar4 = blend->lenBV * numBlends;
  if (numBlends != 0) {
    iVar8 = (int)((ulong)((long)opStack->top - (long)opStack->buffer) >> 3) - iVar4;
    FVar12 = iVar8 + numBlends;
    uVar9 = 0;
    do {
      pFVar2 = blend->BV;
      idx = iVar8 + (int)uVar9;
      CVar5 = cf2_stack_getReal(opStack,idx);
      if (1 < blend->lenBV) {
        lVar11 = 1;
        idx_00 = FVar12;
        do {
          iVar1 = pFVar2[lVar11];
          FVar12 = idx_00 + 1;
          CVar6 = cf2_stack_getReal(opStack,idx_00);
          lVar7 = (long)CVar6 * (long)iVar1;
          CVar5 = CVar5 + (int)((ulong)(lVar7 + (lVar7 >> 0x3f) + 0x8000) >> 0x10);
          lVar11 = lVar11 + 1;
          idx_00 = FVar12;
        } while ((uint)lVar11 < blend->lenBV);
      }
      if ((uint)((ulong)((long)opStack->top - (long)opStack->buffer) >> 3) < idx) {
        piVar3 = opStack->error;
        if ((piVar3 != (int *)0x0) && (*piVar3 == 0)) {
          *piVar3 = 0x82;
        }
      }
      else {
        opStack->buffer[idx].u.r = CVar5;
        opStack->buffer[idx].type = CF2_NumberFixed;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != numBlends);
  }
  uVar10 = iVar4 - numBlends;
  if ((uint)((ulong)((long)opStack->top - (long)opStack->buffer) >> 3) < uVar10) {
    piVar3 = opStack->error;
    if ((piVar3 != (int *)0x0) && (*piVar3 == 0)) {
      *piVar3 = 0xa1;
    }
  }
  else {
    opStack->top = opStack->top + -(ulong)uVar10;
  }
  return;
}

Assistant:

static void
  cf2_doBlend( const CFF_Blend  blend,
               CF2_Stack        opStack,
               CF2_UInt         numBlends )
  {
    CF2_UInt  delta;
    CF2_UInt  base;
    CF2_UInt  i, j;
    CF2_UInt  numOperands = (CF2_UInt)( numBlends * blend->lenBV );


    base  = cf2_stack_count( opStack ) - numOperands;
    delta = base + numBlends;

    for ( i = 0; i < numBlends; i++ )
    {
      const CF2_Fixed*  weight = &blend->BV[1];

      /* start with first term */
      CF2_Fixed  sum = cf2_stack_getReal( opStack, i + base );


      for ( j = 1; j < blend->lenBV; j++ )
        sum = ADD_INT32( sum,
                         FT_MulFix( *weight++,
                                    cf2_stack_getReal( opStack,
                                                       delta++ ) ) );

      /* store blended result  */
      cf2_stack_setReal( opStack, i + base, sum );
    }

    /* leave only `numBlends' results on stack */
    cf2_stack_pop( opStack, numOperands - numBlends );
  }